

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O3

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  idx_t *piVar1;
  data_ptr_t pdVar2;
  idx_t size;
  Vector *pVVar3;
  idx_t iVar4;
  long lVar5;
  long *plVar6;
  idx_t iVar7;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat local_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
  Vector::ToUnifiedFormat(state_vector,count,&local_68);
  size = ListVector::GetListSize(result);
  if (count == 0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    do {
      iVar7 = iVar4;
      if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)(local_68.sel)->sel_vector[iVar4];
      }
      if (**(long **)(local_68.data + iVar7 * 8) != 0) {
        lVar5 = lVar5 + *(long *)(**(long **)(local_68.data + iVar7 * 8) + 0x18);
      }
      iVar4 = iVar4 + 1;
    } while (count != iVar4);
  }
  ListVector::Reserve(result,lVar5 + size);
  pVVar3 = ListVector::GetEntry(result);
  if (count != 0) {
    pdVar2 = result->data;
    iVar4 = 0;
    do {
      iVar7 = iVar4;
      if ((local_68.sel)->sel_vector != (sel_t *)0x0) {
        iVar7 = (idx_t)(local_68.sel)->sel_vector[iVar4];
      }
      plVar6 = *(long **)(local_68.data + iVar7 * 8);
      piVar1 = (idx_t *)(pdVar2 + iVar4 * 0x10);
      *(idx_t *)(pdVar2 + iVar4 * 0x10) = size;
      if (*plVar6 == 0) {
        iVar7 = 0;
      }
      else {
        plVar6 = *(long **)(*plVar6 + 0x10);
        iVar7 = size;
        if (plVar6 != (long *)0x0) {
          do {
            pVVar3->data[size] = (data_t)plVar6[1];
            size = size + 1;
            plVar6 = (long *)*plVar6;
          } while (plVar6 != (long *)0x0);
          iVar7 = *piVar1;
        }
        iVar7 = size - iVar7;
      }
      piVar1[1] = iVar7;
      iVar4 = iVar4 + 1;
    } while (iVar4 != count);
  }
  ListVector::SetListSize(result,size);
  Vector::Verify(result,count);
  if (local_68.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}